

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O1

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,qfloat16 f)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  QIODevice *this_00;
  QCborStreamWriterPrivate *that;
  size_t __n;
  long in_FS_OFFSET;
  undefined1 local_18;
  ushort uStack_17;
  undefined5 uStack_15;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  local_10 = 0xaa;
  _local_18 = CONCAT53(0xaaaaaaaaaa,CONCAT21((short)f.field_0 << 8 | (ushort)f.field_0 >> 8,0xf9));
  __n = *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10);
  if (__n != 0) {
    __n = __n - 1;
    *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10) = __n;
  }
  this_00 = *(QIODevice **)*(uint8_t **)((long)&(_Var1._M_head_impl)->encoder + 8);
  if (this_00 != (QIODevice *)0x0) {
    QIODevice::write(this_00,(int)&local_18,(void *)0x3,__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(qfloat16 f)
{
    d->executeAppend(cbor_encode_half_float, static_cast<const void *>(&f));
}